

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void __thiscall
QColorTransformPrivate::apply<unsigned_int,unsigned_char>
          (QColorTransformPrivate *this,uint *dst,uchar *src,qsizetype count,TransformFlags flags)

{
  long lVar1;
  bool bVar2;
  QColorSpacePrivate *pQVar3;
  longlong *plVar4;
  uint *in_RCX;
  QColorTransformPrivate *in_RDX;
  long in_RSI;
  QColorTransformPrivate *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  qsizetype len;
  qsizetype i;
  QUninitialized<QColorVector,_256> buffer;
  long in_stack_ffffffffffffef98;
  QColorVector *in_stack_ffffffffffffefa0;
  uchar *src_00;
  QColorTransformPrivate *in_stack_ffffffffffffefb8;
  QColorTransformPrivate *this_00;
  long local_1018;
  undefined4 in_stack_ffffffffffffeff0;
  QUninitialized local_1008 [4];
  QFlagsStorage<QColorTransformPrivate::TransformFlag> in_stack_ffffffffffffeffc;
  QColorVector *in_stack_fffffffffffff030;
  QFlagsStorage<QColorTransformPrivate::TransformFlag> in_stack_fffffffffffff03c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d6088);
  bVar2 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
  if (bVar2) {
    updateLutsIn(in_stack_ffffffffffffefb8);
  }
  pQVar3 = QExplicitlySharedDataPointer<const_QColorSpacePrivate>::operator->
                     ((QExplicitlySharedDataPointer<const_QColorSpacePrivate> *)0x4d60ae);
  bVar2 = QColorSpacePrivate::isThreeComponentMatrix(pQVar3);
  if (bVar2) {
    updateLutsOut(in_stack_ffffffffffffefb8);
  }
  for (this_00 = (QColorTransformPrivate *)0x0; (long)this_00 < (long)in_RCX;
      this_00 = (QColorTransformPrivate *)(src_00 + (long)this_00)) {
    local_1018 = (long)in_RCX - (long)this_00;
    plVar4 = qMin<long_long>(&local_1018,&WorkBlockSize);
    src_00 = (uchar *)*plVar4;
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    applyConvertIn<unsigned_char>
              (this_00,src_00,(QColorVector *)CONCAT44(in_R8D,in_stack_ffffffffffffeff0),
               (qsizetype)in_RDI,(TransformFlags)in_stack_ffffffffffffeffc.i);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    pcsAdapt(in_RDI,in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98);
    in_stack_ffffffffffffef98 = in_RSI + (long)this_00 * 4;
    in_stack_ffffffffffffefa0 =
         (QColorVector *)
         ((long)&(this_00->super_QSharedData).ref.super_QAtomicInteger<int>.
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i +
         (long)&(in_RDX->super_QSharedData).ref.super_QAtomicInteger<int>.
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i);
    QUninitialized::operator_cast_to_QColorVector_(local_1008);
    applyConvertOut<unsigned_int,unsigned_char>
              (in_RDX,in_RCX,(uchar *)this_00,in_stack_fffffffffffff030,(qsizetype)src_00,
               (TransformFlags)in_stack_fffffffffffff03c.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorTransformPrivate::apply(D *dst, const S *src, qsizetype count, TransformFlags flags) const
{
    if (colorSpaceIn->isThreeComponentMatrix())
        updateLutsIn();
    if (colorSpaceOut->isThreeComponentMatrix())
        updateLutsOut();

    Q_DECL_UNINITIALIZED QUninitialized<QColorVector, WorkBlockSize> buffer;
    qsizetype i = 0;
    while (i < count) {
        const qsizetype len = qMin(count - i, WorkBlockSize);

        applyConvertIn(src + i, buffer, len, flags);

        pcsAdapt(buffer, len);

        applyConvertOut(dst + i, src + i, buffer, len, flags);

        i += len;
    }
}